

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

InlineeFrameRecord * __thiscall
Js::EntryPointInfo::FindInlineeFrame(EntryPointInfo *this,void *returnAddress)

{
  anon_class_16_2_86790fd3 compare;
  int index_00;
  InProcNativeEntryPointData *this_00;
  InlineeFrameMap *this_01;
  DWORD_PTR DVar1;
  Type *pTVar2;
  int index;
  size_t offset;
  InlineeFrameMap *inlineeFrameMap;
  void *returnAddress_local;
  EntryPointInfo *this_local;
  
  this_00 = GetInProcNativeEntryPointData(this);
  this_01 = InProcNativeEntryPointData::GetInlineeFrameMap(this_00);
  if (this_01 == (InlineeFrameMap *)0x0) {
    this_local = (EntryPointInfo *)0x0;
  }
  else {
    DVar1 = GetNativeAddress(this);
    compare.inlineeFrameMap = this_01;
    compare.offset = (long)returnAddress - DVar1;
    index_00 = JsUtil::
               ReadOnlyList<NativeOffsetInlineeFramePair,Memory::HeapAllocator,DefaultComparer>::
               BinarySearch<Js::EntryPointInfo::FindInlineeFrame(void*)::__0>
                         ((ReadOnlyList<NativeOffsetInlineeFramePair,Memory::HeapAllocator,DefaultComparer>
                           *)this_01,compare);
    if (index_00 == -1) {
      this_local = (EntryPointInfo *)0x0;
    }
    else {
      pTVar2 = JsUtil::
               List<NativeOffsetInlineeFramePair,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_01,index_00);
      this_local = (EntryPointInfo *)pTVar2->record;
    }
  }
  return (InlineeFrameRecord *)this_local;
}

Assistant:

InlineeFrameRecord* EntryPointInfo::FindInlineeFrame(void* returnAddress)
    {
#if ENABLE_OOP_NATIVE_CODEGEN
        if (JITManager::GetJITManager()->IsOOPJITEnabled())  // OOP JIT
        {
            OOPNativeEntryPointData * oopNativeEntryPointData = this->GetOOPNativeEntryPointData();
            char * nativeDataBuffer = oopNativeEntryPointData->GetNativeDataBuffer();
            NativeOffsetInlineeFrameRecordOffset* offsets = (NativeOffsetInlineeFrameRecordOffset*)(nativeDataBuffer + oopNativeEntryPointData->GetInlineeFrameOffsetArrayOffset());
            size_t offset = (size_t)((BYTE*)returnAddress - (BYTE*)this->GetNativeAddress());

            uint inlineeFrameOffsetArrayCount = oopNativeEntryPointData->GetInlineeFrameOffsetArrayCount();
            if (inlineeFrameOffsetArrayCount == 0)
            {
                return nullptr;
            }

            uint fromIndex = 0;
            uint toIndex = inlineeFrameOffsetArrayCount - 1;
            while (fromIndex <= toIndex)
            {
                uint midIndex = fromIndex + (toIndex - fromIndex) / 2;
                auto item = offsets[midIndex];

                if (item.offset >= offset)
                {
                    if (midIndex == 0 || (midIndex > 0 && offsets[midIndex - 1].offset < offset))
                    {
                        if (offsets[midIndex].recordOffset == NativeOffsetInlineeFrameRecordOffset::InvalidRecordOffset)
                        {
                            return nullptr;
                        }
                        else
                        {
                            return (InlineeFrameRecord*)(nativeDataBuffer + offsets[midIndex].recordOffset);
                        }
                    }
                    else
                    {
                        toIndex = midIndex - 1;
                    }
                }
                else
                {
                    fromIndex = midIndex + 1;
                }
            }
            return nullptr;
        }
        else
#endif
        // in-proc JIT
        {
            InlineeFrameMap * inlineeFrameMap = this->GetInProcNativeEntryPointData()->GetInlineeFrameMap();
            if (inlineeFrameMap == nullptr)
            {
                return nullptr;
            }

            size_t offset = (size_t)((BYTE*)returnAddress - (BYTE*)this->GetNativeAddress());
            int index = inlineeFrameMap->BinarySearch([=](const NativeOffsetInlineeFramePair& pair, int index) {
                if (pair.offset >= offset)
                {
                    if (index == 0 || (index > 0 && inlineeFrameMap->Item(index - 1).offset < offset))
                    {
                        return 0;
                    }
                    else
                    {
                        return 1;
                    }
                }
                return -1;
            });

            if (index == -1)
            {
                return nullptr;
            }
            return inlineeFrameMap->Item(index).record;
        }

    }